

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ricecomp.c
# Opt level: O2

int fits_rcomp(int *a,int nx,uchar *c,int clen,int nblock)

{
  int iVar1;
  void *__ptr;
  long lVar2;
  ulong uVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  Buffer_t *pBVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  uint local_7c;
  Buffer local_78;
  long local_58;
  size_t local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  local_78.end = c + clen;
  local_58 = (long)nblock;
  local_50 = local_58 * 4;
  local_78.start = c;
  local_78.current = c;
  __ptr = malloc(local_50);
  iVar6 = -1;
  if (__ptr == (void *)0x0) {
    ffpmsg("fits_rcomp: insufficient memory");
  }
  else {
    local_78.bitbuffer = 0;
    local_78.bits_to_go = 8;
    output_nbits(&local_78,*a,0x20);
    iVar6 = *a;
    local_48 = (long)nx;
    lVar11 = 0;
    local_7c = nblock;
    while (lVar2 = local_48 - lVar11, lVar2 != 0 && lVar11 <= local_48) {
      if (lVar2 < local_58) {
        local_7c = (uint)lVar2;
      }
      uVar9 = 0;
      if (0 < (int)local_7c) {
        uVar9 = (ulong)local_7c;
      }
      dVar15 = 0.0;
      for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
        iVar1 = a[uVar3];
        iVar6 = iVar1 - iVar6;
        uVar7 = iVar6 >> 0x1f ^ iVar6 * 2;
        *(uint *)((long)__ptr + uVar3 * 4) = uVar7;
        dVar15 = dVar15 + (double)uVar7;
        iVar6 = iVar1;
      }
      dVar17 = ((dVar15 - (double)((int)local_7c / 2)) + -1.0) / (double)(int)local_7c;
      dVar16 = 0.0;
      if (0.0 <= dVar17) {
        dVar16 = dVar17;
      }
      uVar7 = 0;
      for (uVar3 = (ulong)dVar16; 1 < (uint)uVar3; uVar3 = (ulong)((uint)uVar3 >> 1)) {
        uVar7 = uVar7 + 1;
      }
      local_40 = lVar11;
      if (uVar7 < 0x19) {
        if (((uVar7 != 0) || (dVar15 != 0.0)) || (NAN(dVar15))) {
          output_nbits(&local_78,uVar7 + 1,5);
          bVar4 = (byte)uVar7;
          uVar3 = local_78._0_8_ & 0xffffffff;
          local_38 = (ulong)-uVar7;
          iVar1 = local_78.bits_to_go;
          for (uVar12 = 0; iVar5 = (int)uVar3, uVar12 != uVar9; uVar12 = uVar12 + 1) {
            uVar13 = *(uint *)((long)__ptr + uVar12 * 4);
            iVar14 = (int)uVar13 >> (bVar4 & 0x1f);
            iVar8 = iVar14 - iVar1;
            if (iVar14 < iVar1) {
              uVar3 = (ulong)(iVar5 << ((byte)(iVar14 + 1) & 0x1f) | 1);
              iVar1 = iVar1 - (iVar14 + 1);
            }
            else {
              *local_78.current = (uchar)(iVar5 << ((byte)iVar1 & 0x1f));
              for (; local_78.current = local_78.current + 1, 7 < iVar8; iVar8 = iVar8 + -8) {
                *local_78.current = '\0';
              }
              iVar1 = 7 - iVar8;
              uVar3 = 1;
            }
            if (uVar7 != 0) {
              uVar13 = uVar13 & ~(-1 << (bVar4 & 0x1f)) | (int)uVar3 << (bVar4 & 0x1f);
              uVar3 = (ulong)uVar13;
              iVar5 = uVar7 - iVar1;
              for (iVar1 = iVar1 + -uVar7; iVar1 < 1; iVar1 = iVar1 + 8) {
                *local_78.current = (uchar)((int)uVar13 >> ((byte)iVar5 & 0x1f));
                local_78.current = local_78.current + 1;
                iVar5 = iVar5 + -8;
              }
            }
          }
          if (local_78.end < local_78.current) {
            ffpmsg("rice_encode: end of buffer");
            free(__ptr);
            return -1;
          }
          local_78.bits_to_go = iVar1;
          local_78.bitbuffer = iVar5;
        }
        else {
          output_nbits(&local_78,0,5);
        }
      }
      else {
        output_nbits(&local_78,0x1a,5);
        for (uVar3 = 0; uVar9 != uVar3; uVar3 = uVar3 + 1) {
          output_nbits(&local_78,*(int *)((long)__ptr + uVar3 * 4),0x20);
        }
      }
      a = (int *)((long)a + local_50);
      lVar11 = local_40 + local_58;
    }
    pBVar10 = local_78.current;
    if (local_78.bits_to_go < 8) {
      *local_78.current = (uchar)(local_78.bitbuffer << ((byte)local_78.bits_to_go & 0x1f));
      pBVar10 = local_78.current + 1;
    }
    free(__ptr);
    iVar6 = (int)pBVar10 - (int)local_78.start;
  }
  return iVar6;
}

Assistant:

int fits_rcomp(int a[],		/* input array			*/
	  int nx,		/* number of input pixels	*/
	  unsigned char *c,	/* output buffer		*/
	  int clen,		/* max length of output		*/
	  int nblock)		/* coding block size		*/
{
Buffer bufmem, *buffer = &bufmem;
/* int bsize;  */
int i, j, thisblock;
int lastpix, nextpix, pdiff;
int v, fs, fsmask, top, fsmax, fsbits, bbits;
int lbitbuffer, lbits_to_go;
unsigned int psum;
double pixelsum, dpsum;
unsigned int *diff;

    /*
     * Original size of each pixel (bsize, bytes) and coding block
     * size (nblock, pixels)
     * Could make bsize a parameter to allow more efficient
     * compression of short & byte images.
     */
/*    bsize = 4;   */

/*    nblock = 32; now an input parameter*/
    /*
     * From bsize derive:
     * FSBITS = # bits required to store FS
     * FSMAX = maximum value for FS
     * BBITS = bits/pixel for direct coding
     */

/*
    switch (bsize) {
    case 1:
	fsbits = 3;
	fsmax = 6;
	break;
    case 2:
	fsbits = 4;
	fsmax = 14;
	break;
    case 4:
	fsbits = 5;
	fsmax = 25;
	break;
    default:
        ffpmsg("rdecomp: bsize must be 1, 2, or 4 bytes");
	return(-1);
    }
*/

    /* move out of switch block, to tweak performance */
    fsbits = 5;
    fsmax = 25;

    bbits = 1<<fsbits;

    /*
     * Set up buffer pointers
     */
    buffer->start = c;
    buffer->current = c;
    buffer->end = c+clen;
    buffer->bits_to_go = 8;
    /*
     * array for differences mapped to non-negative values
     */
    diff = (unsigned int *) malloc(nblock*sizeof(unsigned int));
    if (diff == (unsigned int *) NULL) {
        ffpmsg("fits_rcomp: insufficient memory");
	return(-1);
    }
    /*
     * Code in blocks of nblock pixels
     */
    start_outputing_bits(buffer);

    /* write out first int value to the first 4 bytes of the buffer */
    if (output_nbits(buffer, a[0], 32) == EOF) {
        ffpmsg("rice_encode: end of buffer");
        free(diff);
        return(-1);
    }

    lastpix = a[0];  /* the first difference will always be zero */

    thisblock = nblock;
    for (i=0; i<nx; i += nblock) {
	/* last block may be shorter */
	if (nx-i < nblock) thisblock = nx-i;
	/*
	 * Compute differences of adjacent pixels and map them to unsigned values.
	 * Note that this may overflow the integer variables -- that's
	 * OK, because we can recover when decompressing.  If we were
	 * compressing shorts or bytes, would want to do this arithmetic
	 * with short/byte working variables (though diff will still be
	 * passed as an int.)
	 *
	 * compute sum of mapped pixel values at same time
	 * use double precision for sum to allow 32-bit integer inputs
	 */
	pixelsum = 0.0;
	for (j=0; j<thisblock; j++) {
	    nextpix = a[i+j];
	    pdiff = nextpix - lastpix;
	    diff[j] = (unsigned int) ((pdiff<0) ? ~(pdiff<<1) : (pdiff<<1));
	    pixelsum += diff[j];
	    lastpix = nextpix;
	}

	/*
	 * compute number of bits to split from sum
	 */
	dpsum = (pixelsum - (thisblock/2) - 1)/thisblock;
	if (dpsum < 0) dpsum = 0.0;
	psum = ((unsigned int) dpsum ) >> 1;
	for (fs = 0; psum>0; fs++) psum >>= 1;

	/*
	 * write the codes
	 * fsbits ID bits used to indicate split level
	 */
	if (fs >= fsmax) {
	    /* Special high entropy case when FS >= fsmax
	     * Just write pixel difference values directly, no Rice coding at all.
	     */
	    if (output_nbits(buffer, fsmax+1, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	    for (j=0; j<thisblock; j++) {
		if (output_nbits(buffer, diff[j], bbits) == EOF) {
                    ffpmsg("rice_encode: end of buffer");
                    free(diff);
		    return(-1);
		}
	    }
	} else if (fs == 0 && pixelsum == 0) {
	    /*
	     * special low entropy case when FS = 0 and pixelsum=0 (all
	     * pixels in block are zero.)
	     * Output a 0 and return
	     */
	    if (output_nbits(buffer, 0, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	} else {
	    /* normal case: not either very high or very low entropy */
	    if (output_nbits(buffer, fs+1, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	    fsmask = (1<<fs) - 1;
	    /*
	     * local copies of bit buffer to improve optimization
	     */
	    lbitbuffer = buffer->bitbuffer;
	    lbits_to_go = buffer->bits_to_go;
	    for (j=0; j<thisblock; j++) {
		v = diff[j];
		top = v >> fs;
		/*
		 * top is coded by top zeros + 1
		 */
		if (lbits_to_go >= top+1) {
		    lbitbuffer <<= top+1;
		    lbitbuffer |= 1;
		    lbits_to_go -= top+1;
		} else {
		    lbitbuffer <<= lbits_to_go;
		    putcbuf(lbitbuffer & 0xff,buffer);

		    for (top -= lbits_to_go; top>=8; top -= 8) {
			putcbuf(0, buffer);
		    }
		    lbitbuffer = 1;
		    lbits_to_go = 7-top;
		}
		/*
		 * bottom FS bits are written without coding
		 * code is output_nbits, moved into this routine to reduce overheads
		 * This code potentially breaks if FS>24, so I am limiting
		 * FS to 24 by choice of FSMAX above.
		 */
		if (fs > 0) {
		    lbitbuffer <<= fs;
		    lbitbuffer |= v & fsmask;
		    lbits_to_go -= fs;
		    while (lbits_to_go <= 0) {
			putcbuf((lbitbuffer>>(-lbits_to_go)) & 0xff,buffer);
			lbits_to_go += 8;
		    }
		}
	    }

	    /* check if overflowed output buffer */
	    if (buffer->current > buffer->end) {
                 ffpmsg("rice_encode: end of buffer");
                 free(diff);
		 return(-1);
	    }
	    buffer->bitbuffer = lbitbuffer;
	    buffer->bits_to_go = lbits_to_go;
	}
    }
    done_outputing_bits(buffer);
    free(diff);
    /*
     * return number of bytes used
     */
    return(buffer->current - buffer->start);
}